

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O2

void __thiscall
Diligent::GLProgram::GLProgram
          (GLProgram *this,ShaderGLImpl **ppShaders,Uint32 NumShaders,bool IsSeparableProgram)

{
  Uint32 i;
  ulong uVar1;
  GLenum err;
  GLProgram *local_68;
  ShaderGLImpl **local_60;
  string msg;
  
  local_68 = this;
  local_60 = ppShaders;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GLProg,1);
  std::vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>>::
  vector<Diligent::ShaderGLImpl*const*,void>
            ((vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>> *)
             &local_68->m_AttachedShaders,local_60,local_60 + NumShaders,(allocator_type *)&msg);
  (local_68->m_InfoLog)._M_dataplus._M_p = (pointer)&(local_68->m_InfoLog).field_2;
  (local_68->m_InfoLog)._M_string_length = 0;
  (local_68->m_InfoLog).field_2._M_local_buf[0] = '\0';
  local_68->m_LinkStatus = Undefined;
  local_68->m_BindingsApplied = false;
  (local_68->m_pResources).
  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_68->m_pResources).
  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)(local_68->m_DbgBaseBindings)._M_elems = 0;
  if (IsSeparableProgram && NumShaders != 1) {
    FormatString<char[62]>
              (&msg,(char (*) [62])"Number of shaders must be 1 when separable program is created");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x29);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (IsSeparableProgram) {
    (*__glewProgramParameteri)((local_68->m_GLProg).m_uiHandle,0x8258,1);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[49],char[17],unsigned_int>
                (false,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f,(char (*) [49])"glProgramParameteri(GL_PROGRAM_SEPARABLE) failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  for (uVar1 = 0; NumShaders != uVar1; uVar1 = uVar1 + 1) {
    (*__glewAttachShader)
              ((local_68->m_GLProg).m_uiHandle,(local_60[uVar1]->m_GLShaderObj).m_uiHandle);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[24],char[17],unsigned_int>
                (false,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x36,(char (*) [24])"glAttachShader() failed",(char (*) [17])"\nGL Error Code: ",
                 &err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x36);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  (*__glewLinkProgram)((local_68->m_GLProg).m_uiHandle);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[23],char[17],unsigned_int>
              (false,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44,(char (*) [23])"glLinkProgram() failed",(char (*) [17])"\nGL Error Code: ",&err
              );
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_68->m_LinkStatus = InProgress;
  return;
}

Assistant:

GLProgram::GLProgram(ShaderGLImpl* const* ppShaders,
                     Uint32               NumShaders,
                     bool                 IsSeparableProgram) noexcept :
    m_AttachedShaders{ppShaders, ppShaders + NumShaders}
{
    VERIFY(!IsSeparableProgram || NumShaders == 1, "Number of shaders must be 1 when separable program is created");

    // GL_PROGRAM_SEPARABLE parameter must be set before linking!
    if (IsSeparableProgram)
    {
        glProgramParameteri(m_GLProg, GL_PROGRAM_SEPARABLE, GL_TRUE);
        DEV_CHECK_GL_ERROR("glProgramParameteri(GL_PROGRAM_SEPARABLE) failed");
    }

    for (Uint32 i = 0; i < NumShaders; ++i)
    {
        auto* pCurrShader = ppShaders[i];
        glAttachShader(m_GLProg, pCurrShader->GetGLShaderHandle());
        DEV_CHECK_GL_ERROR("glAttachShader() failed");
    }

    //With separable program objects, interfaces between shader stages may
    //involve the outputs from one program object and the inputs from a
    //second program object. For such interfaces, it is not possible to
    //detect mismatches at link time, because the programs are linked
    //separately. When each such program is linked, all inputs or outputs
    //interfacing with another program stage are treated as active. The
    //linker will generate an executable that assumes the presence of a
    //compatible program on the other side of the interface. If a mismatch
    //between programs occurs, no GL error will be generated, but some or all
    //of the inputs on the interface will be undefined.
    glLinkProgram(m_GLProg);
    DEV_CHECK_GL_ERROR("glLinkProgram() failed");

    // Note: according to the spec, shaders can be detached immediately after glLinkProgram call.
    //       However, on NVidia GPUs this completely disables the GL_KHR_parallel_shader_compile
    //       extension, which barely works already. So we keep shaders attached until the program
    //       is linked.

    m_LinkStatus = LinkStatus::InProgress;
}